

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_conn_setup(Curl_easy *data,connectdata *conn,int sockindex,Curl_dns_entry *remotehost,
                        int ssl_mode)

{
  CURLcode local_30;
  CURLcode result;
  int ssl_mode_local;
  Curl_dns_entry *remotehost_local;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_30 = CURLE_OK;
  if ((((conn->cfilter[sockindex] != (Curl_cfilter *)0x0) || (conn->handler->protocol != 2)) ||
      (local_30 = Curl_cf_https_setup(data,conn,sockindex,remotehost), local_30 == CURLE_OK)) &&
     (conn->cfilter[sockindex] == (Curl_cfilter *)0x0)) {
    local_30 = cf_setup_add(data,conn,sockindex,remotehost,(uint)conn->transport,ssl_mode);
  }
  return local_30;
}

Assistant:

CURLcode Curl_conn_setup(struct Curl_easy *data,
                         struct connectdata *conn,
                         int sockindex,
                         const struct Curl_dns_entry *remotehost,
                         int ssl_mode)
{
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  DEBUGASSERT(conn->handler);

#if !defined(CURL_DISABLE_HTTP)
  if(!conn->cfilter[sockindex] &&
     conn->handler->protocol == CURLPROTO_HTTPS) {
    DEBUGASSERT(ssl_mode != CURL_CF_SSL_DISABLE);
    result = Curl_cf_https_setup(data, conn, sockindex, remotehost);
    if(result)
      goto out;
  }
#endif /* !defined(CURL_DISABLE_HTTP) */

  /* Still no cfilter set, apply default. */
  if(!conn->cfilter[sockindex]) {
    result = cf_setup_add(data, conn, sockindex, remotehost,
                          conn->transport, ssl_mode);
    if(result)
      goto out;
  }

  DEBUGASSERT(conn->cfilter[sockindex]);
out:
  return result;
}